

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab3-0.c
# Opt level: O3

int checkerBig2(void)

{
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar1;
  int iVar2;
  int n;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar2 = -1;
  }
  else {
    iVar2 = 2000000;
    do {
      pcVar1 = ScanInt((FILE *)__stream,(int *)((long)&uStack_28 + 4));
      if (pcVar1 != "PASSED") {
LAB_00102879:
        fclose(__stream);
        goto LAB_00102881;
      }
      if (uStack_28._4_4_ != 0) {
        printf("wrong output -- ");
        goto LAB_00102879;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar2 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar2 == 0) {
      puts("PASSED");
      iVar2 = 0;
    }
    else {
LAB_00102881:
      puts("FAILED");
      iVar2 = 1;
    }
  }
  testN = testN + 1;
  return iVar2;
}

Assistant:

static int checkerBig2(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < 2000000; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if (n != 0) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}